

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O2

int stbtt_PackFontRangesRenderIntoRects
              (stbtt_pack_context *spc,stbtt_fontinfo *info,stbtt_pack_range *ranges,int num_ranges,
              stbrp_rect *rects)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  stbtt_fontinfo *info_00;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  byte *pbVar8;
  ulong uVar9;
  ulong uVar10;
  uchar *puVar11;
  ulong uVar12;
  byte *pbVar13;
  int iVar14;
  stbtt_pack_range *psVar15;
  int iVar16;
  stbrp_rect *psVar17;
  uchar *puVar18;
  ulong uVar19;
  int iVar20;
  long lVar21;
  uchar *puVar22;
  long lVar23;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar24;
  float fVar25;
  int local_fc;
  int local_f8;
  int lsb;
  int x1;
  int y1;
  stbtt_packedchar *local_e8;
  stbtt_pack_range *local_e0;
  ulong local_d8;
  ulong local_d0;
  float local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  long local_b0;
  stbrp_rect *local_a8;
  stbtt_pack_range *local_a0;
  int local_98;
  int local_94;
  int advance;
  int x0;
  int y0;
  uint local_84;
  uint local_80;
  float local_7c;
  float local_78;
  int local_74;
  ulong local_70;
  ulong local_68;
  stbtt_fontinfo *local_60;
  stbrp_rect *local_58;
  stbtt_pack_context *local_50;
  uchar *local_48;
  ulong local_40;
  byte local_38 [8];
  
  local_84 = spc->h_oversample;
  local_80 = spc->v_oversample;
  uVar19 = 0;
  local_d0 = (ulong)(uint)num_ranges;
  if (num_ranges < 1) {
    local_d0 = 0;
  }
  local_74 = 1;
  lVar21 = 0;
  local_a8 = rects;
  local_a0 = ranges;
  local_60 = info;
  local_50 = spc;
  do {
    if (uVar19 == local_d0) {
      spc->h_oversample = local_84;
      spc->v_oversample = local_80;
      return local_74;
    }
    fVar25 = local_a0[uVar19].font_size;
    local_d8 = uVar19;
    if (fVar25 <= 0.0) {
      uStack_c4 = 0x80000000;
      uStack_c0 = 0x80000000;
      uStack_bc = 0x80000000;
      local_c8 = -fVar25 / (float)(ushort)(*(ushort *)(local_60->data + (long)local_60->head + 0x12)
                                           << 8 | *(ushort *)
                                                   (local_60->data + (long)local_60->head + 0x12) >>
                                                  8);
    }
    else {
      local_c8 = stbtt_ScaleForPixelHeight(local_60,fVar25);
      uStack_c4 = extraout_XMM0_Db;
      uStack_c0 = extraout_XMM0_Dc;
      uStack_bc = extraout_XMM0_Dd;
    }
    psVar15 = local_a0 + uVar19;
    bVar1 = psVar15->h_oversample;
    spc->h_oversample = (uint)bVar1;
    fVar25 = (float)bVar1;
    bVar2 = psVar15->v_oversample;
    local_7c = 0.0;
    local_78 = 0.0;
    if (bVar1 != 0) {
      local_78 = (float)(int)(1 - (uint)bVar1) / (fVar25 + fVar25);
    }
    spc->v_oversample = (uint)bVar2;
    fVar24 = (float)bVar2;
    if (bVar2 != 0) {
      local_7c = (float)(int)(1 - (uint)bVar2) / (fVar24 + fVar24);
    }
    x0 = (int)(1.0 / fVar25);
    y0 = (int)(1.0 / fVar24);
    lVar21 = (long)(int)lVar21;
    local_e0 = psVar15;
    for (lVar23 = 0; info_00 = local_60, lVar23 < psVar15->num_chars; lVar23 = lVar23 + 1) {
      if (rects[lVar21].was_packed == 0) {
        local_74 = 0;
      }
      else {
        if (psVar15->array_of_unicode_codepoints == (int *)0x0) {
          iVar16 = psVar15->first_unicode_codepoint_in_range + (int)lVar23;
        }
        else {
          iVar16 = psVar15->array_of_unicode_codepoints[lVar23];
        }
        psVar17 = rects + lVar21;
        local_e8 = psVar15->chardata_for_range + lVar23;
        _x1 = lVar23;
        local_b0 = lVar21;
        local_58 = psVar17;
        iVar4 = stbtt_FindGlyphIndex(local_60,iVar16);
        iVar16 = spc->padding;
        lVar21 = (long)psVar17->x + (long)iVar16;
        psVar17->x = (stbrp_coord)lVar21;
        iVar20 = psVar17->y + iVar16;
        psVar17->y = iVar20;
        iVar7 = psVar17->w - iVar16;
        local_58->w = iVar7;
        iVar16 = local_58->h - iVar16;
        local_58->h = iVar16;
        stbtt_GetGlyphHMetrics(info_00,iVar4,&local_98,&local_fc);
        local_70 = (ulong)local_50->h_oversample;
        local_68 = (ulong)local_50->v_oversample;
        local_40 = CONCAT44(local_40._4_4_,(float)local_70 * local_c8);
        local_48 = (uchar *)CONCAT44(local_48._4_4_,(float)local_68 * local_c8);
        stbtt_GetGlyphBitmapBox
                  (local_60,iVar4,(float)local_70 * local_c8,(float)local_68 * local_c8,&local_94,
                   &advance,&local_f8,&lsb);
        spc = local_50;
        psVar17 = local_58;
        stbtt_MakeGlyphBitmapSubpixel
                  (local_60,local_50->pixels + iVar20 * local_50->stride_in_bytes + lVar21,
                   (iVar7 - (int)local_70) + 1,(iVar16 - (int)local_68) + 1,
                   local_50->stride_in_bytes,(float)local_40,local_48._0_4_,0.0,0.0,iVar4);
        uVar3 = spc->h_oversample;
        iVar16 = psVar17->x;
        iVar4 = psVar17->y;
        iVar7 = psVar17->w;
        iVar20 = psVar17->h;
        if (1 < (ulong)uVar3) {
          local_68 = (ulong)spc->stride_in_bytes;
          puVar22 = spc->pixels + (long)(iVar4 * spc->stride_in_bytes) + (long)iVar16;
          iVar16 = iVar7 - uVar3;
          local_38[0] = 0;
          local_38[1] = 0;
          local_38[2] = 0;
          local_38[3] = 0;
          local_38[4] = 0;
          local_38[5] = 0;
          local_38[6] = 0;
          local_38[7] = 0;
          iVar4 = 0;
          if (iVar20 < 1) {
            iVar20 = iVar4;
          }
          if (iVar16 < 0) {
            iVar16 = -1;
          }
          uVar19 = (long)iVar16 + 1;
          local_40 = uVar19 & 0xffffffff;
          puVar18 = puVar22 + local_40;
          local_70 = CONCAT44(local_70._4_4_,iVar20);
          while (iVar4 != iVar20) {
            local_48 = (uchar *)CONCAT44(local_48._4_4_,iVar4);
            memset(local_38,0,(ulong)uVar3);
            puVar11 = puVar18;
            uVar12 = local_40;
            switch(uVar3) {
            case 2:
              uVar6 = 0;
              for (uVar10 = 0; uVar19 != uVar10; uVar10 = uVar10 + 1) {
                bVar1 = puVar22[uVar10];
                bVar2 = local_38[(uint)uVar10 & 7];
                local_38[(uint)uVar10 + 2 & 7] = bVar1;
                uVar5 = (int)uVar6 + ((uint)bVar1 - (uint)bVar2);
                uVar6 = (ulong)uVar5;
                puVar22[uVar10] = (uchar)(uVar5 >> 1);
              }
              break;
            case 3:
              uVar6 = 0;
              for (uVar10 = 0; uVar19 != uVar10; uVar10 = uVar10 + 1) {
                bVar1 = puVar22[uVar10];
                bVar2 = local_38[(uint)uVar10 & 7];
                local_38[(uint)uVar10 + 3 & 7] = bVar1;
                uVar6 = (ulong)((int)uVar6 + ((uint)bVar1 - (uint)bVar2));
                puVar22[uVar10] = (uchar)(uVar6 / 3);
              }
              break;
            case 4:
              uVar6 = 0;
              for (uVar10 = 0; uVar19 != uVar10; uVar10 = uVar10 + 1) {
                bVar1 = puVar22[uVar10];
                uVar9 = (ulong)((uint)uVar10 & 7);
                local_38[uVar9 ^ 4] = bVar1;
                uVar5 = (int)uVar6 + ((uint)bVar1 - (uint)local_38[uVar9]);
                uVar6 = (ulong)uVar5;
                puVar22[uVar10] = (uchar)(uVar5 >> 2);
              }
              break;
            case 5:
              uVar6 = 0;
              for (uVar10 = 0; uVar19 != uVar10; uVar10 = uVar10 + 1) {
                bVar1 = puVar22[uVar10];
                bVar2 = local_38[(uint)uVar10 & 7];
                local_38[(uint)uVar10 + 5 & 7] = bVar1;
                uVar6 = (ulong)((int)uVar6 + ((uint)bVar1 - (uint)bVar2));
                puVar22[uVar10] = (uchar)(uVar6 / 5);
              }
              break;
            default:
              uVar6 = 0;
              for (uVar10 = 0; uVar19 != uVar10; uVar10 = uVar10 + 1) {
                bVar1 = puVar22[uVar10];
                bVar2 = local_38[(uint)uVar10 & 7];
                local_38[uVar3 + (uint)uVar10 & 7] = bVar1;
                uVar5 = (int)uVar6 + ((uint)bVar1 - (uint)bVar2);
                uVar6 = (ulong)uVar5;
                puVar22[uVar10] = (uchar)(uVar5 / uVar3);
              }
            }
            for (; (long)uVar12 < (long)iVar7; uVar12 = uVar12 + 1) {
              if (*puVar11 != '\0') {
                __assert_fail("pixels[i] == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_truetype.h"
                              ,0xadd,
                              "void stbtt__h_prefilter(unsigned char *, int, int, int, unsigned int)"
                             );
              }
              uVar5 = (int)uVar6 - (uint)local_38[(uint)uVar12 & 7];
              uVar6 = (ulong)uVar5;
              *puVar11 = (uchar)(uVar5 / uVar3);
              puVar11 = puVar11 + 1;
            }
            puVar22 = puVar22 + local_68;
            puVar18 = puVar18 + local_68;
            iVar20 = (int)local_70;
            iVar4 = (int)local_48._0_4_ + 1;
          }
          iVar16 = local_58->x;
          iVar4 = local_58->y;
          iVar7 = local_58->w;
          iVar20 = local_58->h;
          spc = local_50;
        }
        uVar3 = spc->v_oversample;
        if (1 < (ulong)uVar3) {
          lVar23 = (long)spc->stride_in_bytes;
          local_38[0] = 0;
          local_38[1] = 0;
          local_38[2] = 0;
          local_38[3] = 0;
          local_38[4] = 0;
          local_38[5] = 0;
          local_38[6] = 0;
          local_38[7] = 0;
          lVar21 = (long)(iVar4 * spc->stride_in_bytes);
          pbVar8 = spc->pixels + lVar21 + iVar16;
          iVar4 = iVar20 - uVar3;
          iVar14 = 0;
          if (iVar7 < 1) {
            iVar7 = iVar14;
          }
          if (iVar4 < 0) {
            iVar4 = -1;
          }
          uVar19 = (long)iVar4 + 1;
          local_70 = uVar19 & 0xffffffff;
          puVar22 = spc->pixels + lVar23 * local_70 + iVar16 + lVar21;
          local_68 = CONCAT44(local_68._4_4_,iVar7);
          while (iVar14 != iVar7) {
            local_40 = CONCAT44(local_40._4_4_,iVar14);
            local_48 = puVar22;
            memset(local_38,0,(ulong)uVar3);
            puVar22 = local_48;
            uVar12 = local_70;
            switch(uVar3) {
            case 2:
              uVar6 = 0;
              pbVar13 = pbVar8;
              for (uVar10 = 0; uVar19 != uVar10; uVar10 = uVar10 + 1) {
                bVar1 = *pbVar13;
                bVar2 = local_38[(uint)uVar10 & 7];
                local_38[(uint)uVar10 + 2 & 7] = bVar1;
                uVar5 = (int)uVar6 + ((uint)bVar1 - (uint)bVar2);
                uVar6 = (ulong)uVar5;
                *pbVar13 = (byte)(uVar5 >> 1);
                pbVar13 = pbVar13 + lVar23;
              }
              break;
            case 3:
              uVar6 = 0;
              pbVar13 = pbVar8;
              for (uVar10 = 0; uVar19 != uVar10; uVar10 = uVar10 + 1) {
                bVar1 = *pbVar13;
                bVar2 = local_38[(uint)uVar10 & 7];
                local_38[(uint)uVar10 + 3 & 7] = bVar1;
                uVar6 = (ulong)((int)uVar6 + ((uint)bVar1 - (uint)bVar2));
                *pbVar13 = (byte)(uVar6 / 3);
                pbVar13 = pbVar13 + lVar23;
              }
              break;
            case 4:
              uVar6 = 0;
              pbVar13 = pbVar8;
              for (uVar10 = 0; uVar19 != uVar10; uVar10 = uVar10 + 1) {
                bVar1 = *pbVar13;
                uVar9 = (ulong)((uint)uVar10 & 7);
                local_38[uVar9 ^ 4] = bVar1;
                uVar5 = (int)uVar6 + ((uint)bVar1 - (uint)local_38[uVar9]);
                uVar6 = (ulong)uVar5;
                *pbVar13 = (byte)(uVar5 >> 2);
                pbVar13 = pbVar13 + lVar23;
              }
              break;
            case 5:
              uVar6 = 0;
              pbVar13 = pbVar8;
              for (uVar10 = 0; uVar19 != uVar10; uVar10 = uVar10 + 1) {
                bVar1 = *pbVar13;
                bVar2 = local_38[(uint)uVar10 & 7];
                local_38[(uint)uVar10 + 5 & 7] = bVar1;
                uVar6 = (ulong)((int)uVar6 + ((uint)bVar1 - (uint)bVar2));
                *pbVar13 = (byte)(uVar6 / 5);
                pbVar13 = pbVar13 + lVar23;
              }
              break;
            default:
              uVar6 = 0;
              pbVar13 = pbVar8;
              for (uVar10 = 0; uVar19 != uVar10; uVar10 = uVar10 + 1) {
                bVar1 = *pbVar13;
                bVar2 = local_38[(uint)uVar10 & 7];
                local_38[uVar3 + (uint)uVar10 & 7] = bVar1;
                uVar5 = (int)uVar6 + ((uint)bVar1 - (uint)bVar2);
                uVar6 = (ulong)uVar5;
                *pbVar13 = (byte)(uVar5 / uVar3);
                pbVar13 = pbVar13 + lVar23;
              }
            }
            for (; (long)uVar12 < (long)iVar20; uVar12 = uVar12 + 1) {
              if (*puVar22 != '\0') {
                __assert_fail("pixels[i*stride_in_bytes] == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_truetype.h"
                              ,0xb1b,
                              "void stbtt__v_prefilter(unsigned char *, int, int, int, unsigned int)"
                             );
              }
              uVar5 = (int)uVar6 - (uint)local_38[(uint)uVar12 & 7];
              uVar6 = (ulong)uVar5;
              *puVar22 = (uchar)(uVar5 / uVar3);
              puVar22 = puVar22 + lVar23;
            }
            pbVar8 = pbVar8 + 1;
            puVar22 = local_48 + 1;
            iVar7 = (int)local_68;
            iVar14 = (int)(float)local_40 + 1;
          }
          iVar16 = local_58->x;
          iVar4 = local_58->y;
          iVar7 = local_58->w;
          iVar20 = local_58->h;
          spc = local_50;
        }
        local_e8->x0 = (unsigned_short)iVar16;
        local_e8->y0 = (unsigned_short)iVar4;
        local_e8->x1 = (unsigned_short)iVar16 + (short)iVar7;
        local_e8->y1 = (unsigned_short)iVar4 + (short)iVar20;
        local_e8->xadvance = (float)local_98 * local_c8;
        local_e8->xoff = (float)local_94 * (float)x0 + local_78;
        local_e8->yoff = (float)advance * (float)y0 + local_7c;
        local_e8->xoff2 = (float)(local_94 + iVar7) * (float)x0 + local_78;
        local_e8->yoff2 = (float)(advance + iVar20) * (float)y0 + local_7c;
        lVar23 = _x1;
        rects = local_a8;
        psVar15 = local_e0;
        lVar21 = local_b0;
      }
      lVar21 = lVar21 + 1;
    }
    uVar19 = local_d8 + 1;
  } while( true );
}

Assistant:

STBTT_DEF int stbtt_PackFontRangesRenderIntoRects(stbtt_pack_context *spc, stbtt_fontinfo *info, stbtt_pack_range *ranges, int num_ranges, stbrp_rect *rects)
{
   int i,j,k, return_value = 1;

   // save current values
   int old_h_over = spc->h_oversample;
   int old_v_over = spc->v_oversample;

   k = 0;
   for (i=0; i < num_ranges; ++i) {
      float fh = ranges[i].font_size;
      float scale = fh > 0 ? stbtt_ScaleForPixelHeight(info, fh) : stbtt_ScaleForMappingEmToPixels(info, -fh);
      float recip_h,recip_v,sub_x,sub_y;
      spc->h_oversample = ranges[i].h_oversample;
      spc->v_oversample = ranges[i].v_oversample;
      recip_h = 1.0f / spc->h_oversample;
      recip_v = 1.0f / spc->v_oversample;
      sub_x = stbtt__oversample_shift(spc->h_oversample);
      sub_y = stbtt__oversample_shift(spc->v_oversample);
      for (j=0; j < ranges[i].num_chars; ++j) {
         stbrp_rect *r = &rects[k];
         if (r->was_packed) {
            stbtt_packedchar *bc = &ranges[i].chardata_for_range[j];
            int advance, lsb, x0,y0,x1,y1;
            int codepoint = ranges[i].array_of_unicode_codepoints == NULL ? ranges[i].first_unicode_codepoint_in_range + j : ranges[i].array_of_unicode_codepoints[j];
            int glyph = stbtt_FindGlyphIndex(info, codepoint);
            stbrp_coord pad = (stbrp_coord) spc->padding;

            // pad on left and top
            r->x += pad;
            r->y += pad;
            r->w -= pad;
            r->h -= pad;
            stbtt_GetGlyphHMetrics(info, glyph, &advance, &lsb);
            stbtt_GetGlyphBitmapBox(info, glyph,
                                    scale * spc->h_oversample,
                                    scale * spc->v_oversample,
                                    &x0,&y0,&x1,&y1);
            stbtt_MakeGlyphBitmapSubpixel(info,
                                          spc->pixels + r->x + r->y*spc->stride_in_bytes,
                                          r->w - spc->h_oversample+1,
                                          r->h - spc->v_oversample+1,
                                          spc->stride_in_bytes,
                                          scale * spc->h_oversample,
                                          scale * spc->v_oversample,
                                          0,0,
                                          glyph);

            if (spc->h_oversample > 1)
               stbtt__h_prefilter(spc->pixels + r->x + r->y*spc->stride_in_bytes,
                                  r->w, r->h, spc->stride_in_bytes,
                                  spc->h_oversample);

            if (spc->v_oversample > 1)
               stbtt__v_prefilter(spc->pixels + r->x + r->y*spc->stride_in_bytes,
                                  r->w, r->h, spc->stride_in_bytes,
                                  spc->v_oversample);

            bc->x0       = (stbtt_int16)  r->x;
            bc->y0       = (stbtt_int16)  r->y;
            bc->x1       = (stbtt_int16) (r->x + r->w);
            bc->y1       = (stbtt_int16) (r->y + r->h);
            bc->xadvance =                scale * advance;
            bc->xoff     =       (float)  x0 * recip_h + sub_x;
            bc->yoff     =       (float)  y0 * recip_v + sub_y;
            bc->xoff2    =                (x0 + r->w) * recip_h + sub_x;
            bc->yoff2    =                (y0 + r->h) * recip_v + sub_y;
         } else {
            return_value = 0; // if any fail, report failure
         }

         ++k;
      }
   }

   // restore original values
   spc->h_oversample = old_h_over;
   spc->v_oversample = old_v_over;

   return return_value;
}